

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblp_std.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *__lhs;
  bool bVar1;
  int worker_num;
  ostream *poVar2;
  Identifier local_350;
  Context<char> context;
  
  if (argc < 1) {
    return 1;
  }
  worker_num = atoi(argv[1]);
  if ((uint)argc < 3) {
    Centaurus::Context<char>::Context(&context,"../../grammars/xml.cgr");
  }
  else {
    __lhs = argv[2];
    std::__cxx11::string::string((string *)&context,"dry",(allocator *)&local_350);
    bVar1 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&context);
    std::__cxx11::string::~string((string *)&context);
    Centaurus::Context<char>::Context(&context,"../../grammars/xml.cgr");
    if (bVar1) goto LAB_00110457;
  }
  Centaurus::Identifier::Identifier(&local_350,L"ElementBody");
  Centaurus::Context<char>::attach(&context,&local_350,parseElementBody);
  Centaurus::Identifier::~Identifier(&local_350);
  Centaurus::Identifier::Identifier(&local_350,L"Name");
  Centaurus::Context<char>::attach(&context,&local_350,parseName);
  Centaurus::Identifier::~Identifier(&local_350);
  Centaurus::Identifier::Identifier(&local_350,L"Value");
  Centaurus::Context<char>::attach(&context,&local_350,parseValue);
  Centaurus::Identifier::~Identifier(&local_350);
  Centaurus::Identifier::Identifier(&local_350,L"Attribute");
  Centaurus::Context<char>::attach(&context,&local_350,parseAttribute);
  Centaurus::Identifier::~Identifier(&local_350);
  Centaurus::Identifier::Identifier(&local_350,L"Content");
  Centaurus::Context<char>::attach(&context,&local_350,parseContent);
  Centaurus::Identifier::~Identifier(&local_350);
  Centaurus::Identifier::Identifier(&local_350,L"Element");
  Centaurus::Context<char>::attach(&context,&local_350,parseElement);
  Centaurus::Identifier::~Identifier(&local_350);
LAB_00110457:
  std::chrono::_V2::system_clock::now();
  Centaurus::Context<char>::parse(&context,"../../datasets/dblp.xml",worker_num);
  std::chrono::_V2::system_clock::now();
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,worker_num);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  Centaurus::Context<char>::~Context(&context);
  return 0;
}

Assistant:

int main(int argc, const char *argv[])
{
    if (argc < 1) return 1;
    int worker_num = std::atoi(argv[1]);
    bool no_action = argc >= 3 && argv[2] == std::string("dry");

    const char *input_path = "../../datasets/dblp.xml";
    const char *grammar_path = "../../grammars/xml.cgr";

    Context<char> context{grammar_path};

    if (!no_action) {
      context.attach(L"ElementBody", parseElementBody);
      context.attach(L"Name", parseName);
      context.attach(L"Value", parseValue);
      context.attach(L"Attribute", parseAttribute);
      context.attach(L"Content", parseContent);
      context.attach(L"Element", parseElement);
    }

    using namespace std::chrono;

    auto start = high_resolution_clock::now();;

    context.parse(input_path, worker_num);

    auto end = high_resolution_clock::now();;

    std::cout << worker_num << " " << duration_cast<milliseconds>(end - start).count() << std::endl;

    return 0;
}